

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Layer.cpp
# Opt level: O2

ostream * PyreNet::operator<<(ostream *os,Layer *l)

{
  pointer pPVar1;
  uint uVar2;
  ostream *poVar3;
  activationType activation;
  Perceptron *p;
  pointer p_00;
  string local_48;
  
  uVar2 = (*l->activation->_vptr_Activation[1])();
  ActivationFactory::toString_abi_cxx11_(&local_48,(ActivationFactory *)(ulong)uVar2,activation);
  poVar3 = std::operator<<(os,(string *)&local_48);
  std::operator<<(poVar3," ");
  std::__cxx11::string::~string((string *)&local_48);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)os);
  std::operator<<(poVar3," ");
  pPVar1 = (l->nodes).super__Vector_base<PyreNet::Perceptron,_std::allocator<PyreNet::Perceptron>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (p_00 = (l->nodes).
              super__Vector_base<PyreNet::Perceptron,_std::allocator<PyreNet::Perceptron>_>._M_impl.
              super__Vector_impl_data._M_start; p_00 != pPVar1; p_00 = p_00 + 1) {
    poVar3 = operator<<(os,p_00);
    std::operator<<(poVar3," ");
  }
  return os;
}

Assistant:

std::ostream &operator<<(std::ostream& os, const Layer &l) {
        os << ActivationFactory::toString(l.activation->type()) << " ";
        os << l.nodes.size() << " ";
        for (const Perceptron& p : l.nodes)
            os << p << " ";
        return os;
    }